

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_pad2.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105118) = 0;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x180);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int k = -9384;

    cout << -k % 1000 << endl;
}